

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O3

int bitmap_and(bitmap_t dst,bitmap_t src1,bitmap_t src2)

{
  byte bVar1;
  bitmap_el_t *pbVar2;
  bitmap_el_t *pbVar3;
  ulong uVar4;
  bitmap_t pVVar5;
  MIR_context_t ctx;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  bitmap_t pVVar8;
  bitmap_t pVVar9;
  char *pcVar10;
  bitmap_t extraout_RDX;
  bitmap_t extraout_RDX_00;
  char *pcVar11;
  bitmap_t pVVar12;
  bitmap_t bm;
  bitmap_t unaff_RBP;
  bitmap_t pVVar13;
  bitmap_t pVVar14;
  const_bitmap_t src;
  const_bitmap_t nb;
  const_bitmap_t nb_00;
  char *pcVar15;
  bitmap_t pVVar16;
  bitmap_el_t bVar17;
  bitmap_el_t bVar18;
  size_t sVar19;
  bitmap_t pVVar20;
  bitmap_t unaff_R12;
  bitmap_t unaff_R13;
  ulong uVar21;
  bitmap_t pVVar22;
  long *plVar23;
  ulong uVar24;
  undefined8 uVar25;
  const_bitmap_t pVVar26;
  
  if (src1 == (bitmap_t)0x0) {
    bitmap_and_cold_4();
    pVVar14 = src1;
    pVVar9 = dst;
LAB_00165e0e:
    bitmap_and_cold_3();
LAB_00165e13:
    bitmap_and_cold_2();
  }
  else {
    pVVar14 = src1;
    pVVar9 = dst;
    if (src2 == (bitmap_t)0x0) goto LAB_00165e0e;
    unaff_R13 = (bitmap_t)src2->els_num;
    unaff_R12 = (bitmap_t)src1->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    pVVar14 = (bitmap_t)((long)unaff_RBP << 6);
    bitmap_expand(dst,(size_t)pVVar14);
    if (dst == (bitmap_t)0x0) goto LAB_00165e13;
    pbVar2 = dst->varr;
    if (unaff_RBP == (bitmap_t)0x0) {
      if (pbVar2 != (bitmap_el_t *)0x0) {
        pVVar8 = (bitmap_t)0x0;
        goto LAB_00165df7;
      }
    }
    else {
      pbVar3 = src1->varr;
      pVVar14 = (bitmap_t)src2->varr;
      pVVar8 = (bitmap_t)0x0;
      pVVar12 = (bitmap_t)0x0;
      do {
        if (pVVar12 < unaff_R12) {
          bVar17 = pbVar3[(long)pVVar12];
        }
        else {
          bVar17 = 0;
        }
        if (pVVar12 < unaff_R13) {
          bVar18 = (&pVVar14->els_num)[(long)pVVar12];
        }
        else {
          bVar18 = 0;
        }
        pVVar9 = (bitmap_t)((long)&pVVar12->els_num + 1);
        if ((bVar18 & bVar17) != 0) {
          pVVar8 = pVVar9;
        }
        pbVar2[(long)pVVar12] = bVar18 & bVar17;
        pVVar12 = pVVar9;
      } while (unaff_RBP != pVVar9);
      if (pVVar8 <= (bitmap_t)dst->els_num) {
LAB_00165df7:
        dst->els_num = (size_t)pVVar8;
        return (int)pbVar2;
      }
    }
  }
  bitmap_and_cold_1();
  pbVar2 = pVVar9[5].varr;
  if ((pbVar2 != (bitmap_el_t *)0x0) && (pbVar2[2] != 0)) {
    *pbVar2 = 0;
    return (int)pbVar2;
  }
  dom_con_func_0_cold_1();
  pVVar9 = (bitmap_t)pVVar9[3].size;
  bitmap_copy(pVVar9,(const_bitmap_t)pVVar14[5].varr);
  plVar23 = (long *)pVVar14[2].els_num;
  pVVar8 = (bitmap_t)pVVar14[5].varr;
  src = *(const_bitmap_t *)(*plVar23 + 0x90);
  bitmap_copy(pVVar8,src);
  while (plVar23 = (long *)plVar23[3], plVar23 != (long *)0x0) {
    src = (const_bitmap_t)pVVar14[5].varr;
    pVVar8 = src;
    bitmap_and(src,src,*(bitmap_t *)(*plVar23 + 0x90));
  }
  pVVar12 = (bitmap_t)pVVar14[5].varr;
  if (pVVar12 == (bitmap_t)0x0) {
    dom_con_func_n_cold_2();
  }
  else if (pVVar9 != (bitmap_t)0x0) {
    uVar24 = pVVar12->els_num;
    uVar4 = pVVar9->els_num;
    pVVar14 = pVVar9;
    uVar21 = uVar4;
    if (uVar4 < uVar24) {
      pVVar14 = pVVar12;
      pVVar12 = pVVar9;
      uVar21 = uVar24;
      uVar24 = uVar4;
    }
    pbVar2 = pVVar14->varr;
    iVar6 = bcmp(pVVar12->varr,pbVar2,uVar24 * 8);
    iVar7 = 1;
    if (iVar6 == 0) {
      if (uVar24 < uVar21) {
        do {
          if (pbVar2[uVar24] != 0) {
            return 1;
          }
          uVar24 = uVar24 + 1;
        } while (uVar21 != uVar24);
      }
      iVar7 = 0;
    }
    return iVar7;
  }
  dom_con_func_n_cold_1();
  pVVar12 = (bitmap_t)pVVar8[3].size;
  if ((pVVar12 != (bitmap_t)0x0) && (pVVar12->varr != (bitmap_el_t *)0x0)) {
    pVVar12->els_num = 0;
    uVar24 = src->els_num;
    bitmap_expand(pVVar12,uVar24 + 1);
    pVVar12->varr[uVar24 >> 6] = pVVar12->varr[uVar24 >> 6] | 1L << (uVar24 & 0x3f);
    iVar6 = bitmap_ior((bitmap_t)src[6].els_num,(bitmap_t)src[5].varr,(bitmap_t)pVVar8[3].size);
    return iVar6;
  }
  dom_trans_func_cold_1();
  if (src == (const_bitmap_t)0x0) {
    bitmap_ior_cold_4();
    nb = src;
    bm = pVVar8;
LAB_00166050:
    bitmap_ior_cold_3();
LAB_00166055:
    bitmap_ior_cold_2();
    pVVar8 = pVVar9;
    src = pVVar12;
  }
  else {
    nb = src;
    bm = pVVar8;
    pVVar14 = extraout_RDX;
    if (extraout_RDX == (bitmap_t)0x0) goto LAB_00166050;
    unaff_R13 = (bitmap_t)extraout_RDX->els_num;
    unaff_R12 = (bitmap_t)src->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (const_bitmap_t)((long)unaff_RBP << 6);
    bitmap_expand(pVVar8,(size_t)nb);
    pVVar9 = pVVar8;
    pVVar12 = src;
    if (pVVar8 == (bitmap_t)0x0) goto LAB_00166055;
    pbVar2 = pVVar8->varr;
    if (unaff_RBP == (bitmap_t)0x0) {
      if (pbVar2 != (bitmap_el_t *)0x0) {
        pVVar9 = (bitmap_t)0x0;
        iVar6 = 0;
        goto LAB_00166039;
      }
    }
    else {
      nb = (const_bitmap_t)src->varr;
      bm = (bitmap_t)extraout_RDX->varr;
      iVar6 = 0;
      pVVar9 = (bitmap_t)0x0;
      pVVar12 = (bitmap_t)0x0;
      do {
        if (pVVar12 < unaff_R12) {
          sVar19 = (&nb->els_num)[(long)pVVar12];
        }
        else {
          sVar19 = 0;
        }
        if (pVVar12 < unaff_R13) {
          bVar17 = (&bm->els_num)[(long)pVVar12];
        }
        else {
          bVar17 = 0;
        }
        pVVar14 = (bitmap_t)pbVar2[(long)pVVar12];
        pVVar20 = (bitmap_t)(bVar17 | sVar19);
        pVVar22 = (bitmap_t)((long)&pVVar12->els_num + 1);
        if (pVVar20 != (bitmap_t)0x0) {
          pVVar9 = pVVar22;
        }
        pbVar2[(long)pVVar12] = (bitmap_el_t)pVVar20;
        if (pVVar14 != pVVar20) {
          iVar6 = 1;
        }
        pVVar12 = pVVar22;
      } while (unaff_RBP != pVVar22);
      if (pVVar9 <= (bitmap_t)pVVar8->els_num) {
LAB_00166039:
        pVVar8->els_num = (size_t)pVVar9;
        return iVar6;
      }
    }
  }
  bitmap_ior_cold_1();
  uVar25 = extraout_RAX;
  pVVar9 = pVVar8;
  pVVar26 = src;
  if (nb == (const_bitmap_t)0x0) {
    pVVar20 = pVVar14;
    bitmap_and_compl_cold_4();
    nb_00 = nb;
    pVVar12 = bm;
    pVVar22 = pVVar14;
    pVVar14 = pVVar20;
LAB_00166118:
    bitmap_and_compl_cold_3();
  }
  else {
    nb_00 = nb;
    pVVar12 = bm;
    pVVar22 = extraout_RDX_00;
    if (extraout_RDX_00 == (bitmap_t)0x0) goto LAB_00166118;
    pVVar20 = (bitmap_t)extraout_RDX_00->els_num;
    pVVar5 = (bitmap_t)nb->els_num;
    pVVar13 = pVVar20;
    if (pVVar20 < pVVar5) {
      pVVar13 = pVVar5;
    }
    nb_00 = (const_bitmap_t)((long)pVVar13 << 6);
    bitmap_expand(bm,(size_t)nb_00);
    pVVar8 = bm;
    pVVar22 = extraout_RDX_00;
    src = nb;
    if (bm != (bitmap_t)0x0) {
      pbVar2 = bm->varr;
      if (pVVar13 == (bitmap_t)0x0) {
        if (pbVar2 != (bitmap_el_t *)0x0) {
          pVVar8 = (bitmap_t)0x0;
          goto LAB_00166101;
        }
      }
      else {
        pbVar3 = nb->varr;
        nb_00 = (const_bitmap_t)extraout_RDX_00->varr;
        pVVar8 = (bitmap_t)0x0;
        pVVar16 = (bitmap_t)0x0;
        do {
          if (pVVar16 < pVVar5) {
            bVar17 = pbVar3[(long)pVVar16];
          }
          else {
            bVar17 = 0;
          }
          uVar24 = 0xffffffffffffffff;
          if (pVVar16 < pVVar20) {
            uVar24 = ~(&nb_00->els_num)[(long)pVVar16];
          }
          pVVar12 = (bitmap_t)((long)&pVVar16->els_num + 1);
          if ((uVar24 & bVar17) != 0) {
            pVVar8 = pVVar12;
          }
          pbVar2[(long)pVVar16] = uVar24 & bVar17;
          pVVar16 = pVVar12;
        } while (pVVar13 != pVVar12);
        if (pVVar8 <= (bitmap_t)bm->els_num) {
LAB_00166101:
          bm->els_num = (size_t)pVVar8;
          return (int)pbVar2;
        }
      }
      goto LAB_00166122;
    }
  }
  bitmap_and_compl_cold_2();
  bm = pVVar8;
  nb = src;
LAB_00166122:
  bitmap_and_compl_cold_1();
  if (((FILE *)pVVar12[1].els_num != (FILE *)0x0) && (1 < (int)pVVar12[1].size)) {
    bVar1 = *(byte *)((long)&nb_00->size + 1);
    pcVar15 = "may/must alloca ";
    ctx = (MIR_context_t)pVVar12->els_num;
    if ((bVar1 & 3) == 0) {
      pcVar15 = "must alloca";
    }
    pcVar10 = "const val";
    pcVar11 = "";
    if (bVar1 != 0) {
      pcVar11 = pcVar15;
    }
    if ((char)nb_00->size == '\0') {
      pcVar10 = "val";
    }
    fprintf((FILE *)pVVar12[1].els_num,"%s%s=%lld for insn %lu:",pcVar11,pcVar10,nb_00[1].els_num,
            (ulong)*(uint *)((long)&nb_00->size + 4),bm,pVVar22,nb,uVar25,pVVar9,unaff_R12,unaff_R13
            ,pVVar14,pVVar26,unaff_RBP);
    MIR_output_insn(ctx,(FILE *)pVVar12[1].els_num,(MIR_insn_t_conflict)nb_00->els_num,
                    (MIR_func_t)pVVar12->varr[8],1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static inline int bitmap_and (bitmap_t dst, bitmap_t src1, bitmap_t src2) {
  return bitmap_op2 (dst, src1, src2, bitmap_el_and);
}